

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cepstrum_to_autocorrelation.cc
# Opt level: O1

bool __thiscall
sptk::CepstrumToAutocorrelation::Run
          (CepstrumToAutocorrelation *this,vector<double,_std::allocator<double>_> *cepstrum,
          vector<double,_std::allocator<double>_> *autocorrelation,Buffer *buffer)

{
  size_type __new_size;
  vector<double,_std::allocator<double>_> *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  double *pdVar7;
  bool bVar8;
  size_t __n;
  long lVar9;
  double *pdVar10;
  double dVar11;
  int local_40;
  
  if (this->is_valid_ != true) {
    return false;
  }
  if ((buffer != (Buffer *)0x0) &&
     (autocorrelation != (vector<double,_std::allocator<double>_> *)0x0)) {
    iVar1 = this->num_input_order_;
    lVar9 = (long)iVar1 + 1;
    if ((long)(cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == lVar9) {
      iVar2 = this->num_output_order_;
      __new_size = (long)iVar2 + 1;
      if ((long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(autocorrelation,__new_size);
      }
      iVar3 = (this->fast_fourier_transform_).fft_length_;
      this_00 = &buffer->real_part_;
      if ((long)(buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3 != (long)iVar3) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,(long)iVar3);
      }
      pdVar4 = (cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __n = (long)(cepstrum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pdVar4;
      if (__n != 0) {
        memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,pdVar4,__n);
      }
      pdVar5 = (buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar6 = (buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar4 = pdVar5 + lVar9;
      if (pdVar4 != pdVar6) {
        memset(pdVar4,0,((long)pdVar6 + (-0x10 - (long)(pdVar5 + iVar1)) & 0xfffffffffffffff8U) + 8)
        ;
      }
      bVar8 = RealValuedFastFourierTransform::Run
                        (&this->fast_fourier_transform_,this_00,&buffer->imag_part_,
                         &buffer->buffer_for_fast_fourier_transform_);
      if (bVar8) {
        pdVar7 = (buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pdVar10 = (buffer->real_part_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start; pdVar10 != pdVar7;
            pdVar10 = pdVar10 + 1) {
          dVar11 = exp(*pdVar10 + *pdVar10);
          *pdVar10 = dVar11;
        }
        bVar8 = RealValuedFastFourierTransform::Run
                          (&this->fast_fourier_transform_,this_00,&buffer->imag_part_,
                           &buffer->buffer_for_fast_fourier_transform_);
        if (bVar8) {
          local_40 = (int)__new_size;
          if (local_40 != 0) {
            pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5 = (autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            lVar9 = 0;
            do {
              *(double *)((long)pdVar5 + lVar9) =
                   *(double *)((long)pdVar4 + lVar9) * (1.0 / (double)iVar3);
              lVar9 = lVar9 + 8;
            } while ((long)iVar2 * 8 + 8 != lVar9);
            return true;
          }
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool CepstrumToAutocorrelation::Run(
    const std::vector<double>& cepstrum, std::vector<double>* autocorrelation,
    CepstrumToAutocorrelation::Buffer* buffer) const {
  // Check inputs.
  const int input_length(num_input_order_ + 1);
  if (!is_valid_ || cepstrum.size() != static_cast<std::size_t>(input_length) ||
      NULL == autocorrelation || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int output_length(num_output_order_ + 1);
  if (autocorrelation->size() != static_cast<std::size_t>(output_length)) {
    autocorrelation->resize(output_length);
  }
  const int fft_length(fast_fourier_transform_.GetFftLength());
  if (buffer->real_part_.size() != static_cast<std::size_t>(fft_length)) {
    buffer->real_part_.resize(fft_length);
  }

  std::copy(cepstrum.begin(), cepstrum.end(), buffer->real_part_.begin());
  std::fill(buffer->real_part_.begin() + input_length, buffer->real_part_.end(),
            0.0);

  if (!fast_fourier_transform_.Run(
          &buffer->real_part_, &buffer->imag_part_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  std::transform(buffer->real_part_.begin(), buffer->real_part_.end(),
                 buffer->real_part_.begin(),
                 [](double x) { return std::exp(2.0 * x); });

  if (!fast_fourier_transform_.Run(
          &buffer->real_part_, &buffer->imag_part_,
          &buffer->buffer_for_fast_fourier_transform_)) {
    return false;
  }

  const double z(1.0 / fft_length);
  std::transform(buffer->real_part_.begin(),
                 buffer->real_part_.begin() + output_length,
                 autocorrelation->begin(), [z](double x) { return x * z; });

  return true;
}